

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.h
# Opt level: O2

void WriteStringToFile(FILE *file_ptr,string *str)

{
  ostream *poVar1;
  allocator local_5e;
  allocator local_5d;
  Logger local_5c;
  size_t len;
  string local_38;
  
  if (file_ptr == (FILE *)0x0) {
    local_5c.severity_ = ERR;
    std::__cxx11::string::string
              ((string *)&len,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/base/file_util.h"
               ,&local_5d);
    std::__cxx11::string::string((string *)&local_38,"WriteStringToFile",&local_5e);
    poVar1 = Logger::Start(ERR,(string *)&len,0x129,&local_38);
    poVar1 = std::operator<<(poVar1,"CHECK failed ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/base/file_util.h"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x129);
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"file_ptr");
    std::operator<<(poVar1," == NULL \n");
  }
  else {
    len = str->_M_string_length;
    if (len != 0) {
      WriteDataToDisk(file_ptr,(char *)&len,8);
      WriteDataToDisk(file_ptr,(str->_M_dataplus)._M_p,len);
      return;
    }
    local_5c.severity_ = ERR;
    std::__cxx11::string::string
              ((string *)&len,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/base/file_util.h"
               ,&local_5d);
    std::__cxx11::string::string((string *)&local_38,"WriteStringToFile",&local_5e);
    poVar1 = Logger::Start(ERR,(string *)&len,299,&local_38);
    poVar1 = std::operator<<(poVar1,"CHECK failed ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/base/file_util.h"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,299);
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"!str.empty()");
    poVar1 = std::operator<<(poVar1," = ");
    poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
    std::operator<<(poVar1,"\n");
  }
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&len);
  Logger::~Logger(&local_5c);
  abort();
}

Assistant:

inline void WriteStringToFile(FILE * file_ptr, const std::string &str) {
  CHECK_NOTNULL(file_ptr);
  // We do not want to serialize an empty string
  CHECK(!str.empty());
  size_t len =str.size();
  // First, write the length of string
  WriteDataToDisk(file_ptr, reinterpret_cast<char *>(&len), sizeof(len));
  // Then, write the data of string
  WriteDataToDisk(file_ptr, const_cast<char *>(str.data()), len);
}